

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTestNoImplicit::Run(DyndepParserTestNoImplicit *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference __x;
  pointer ppVar6;
  size_type sVar7;
  _Self local_28;
  _Self local_20;
  iterator i;
  int fail_count;
  DyndepParserTestNoImplicit *this_local;
  
  i._M_node._4_4_ = testing::Test::AssertionFailures(g_current_test);
  DyndepParserTest::AssertParse
            (&this->super_DyndepParserTest,"ninja_dyndep_version = 1\nbuild out: dyndep\n");
  iVar2 = i._M_node._4_4_;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    sVar5 = std::
            map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
            ::size(&(this->super_DyndepParserTest).dyndep_file_.
                    super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                  );
    testing::Test::Check
              (pTVar1,sVar5 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
               ,0x16a,"1u == dyndep_file_.size()");
    __x = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                    (&(this->super_DyndepParserTest).state_.edges_,0);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         ::find(&(this->super_DyndepParserTest).dyndep_file_.
                 super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                ,__x);
    pTVar1 = g_current_test;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
         ::end(&(this->super_DyndepParserTest).dyndep_file_.
                super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              );
    bVar3 = std::operator!=(&local_20,&local_28);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                       ,0x16c,"i != dyndep_file_.end()");
    pTVar1 = g_current_test;
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->(&local_20);
      testing::Test::Check
                (pTVar1,((ppVar6->second).restat_ & 1U) == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16d,"false == i->second.restat_");
      pTVar1 = g_current_test;
      ppVar6 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->(&local_20);
      sVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                        (&(ppVar6->second).implicit_outputs_);
      testing::Test::Check
                (pTVar1,sVar7 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16e,"0u == i->second.implicit_outputs_.size()");
      pTVar1 = g_current_test;
      ppVar6 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->(&local_20);
      sVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&(ppVar6->second).implicit_inputs_)
      ;
      testing::Test::Check
                (pTVar1,sVar7 == 0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x16f,"0u == i->second.implicit_inputs_.size()");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, NoImplicit) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  EXPECT_EQ(0u, i->second.implicit_outputs_.size());
  EXPECT_EQ(0u, i->second.implicit_inputs_.size());
}